

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::ProtoStreamObjectSource
          (ProtoStreamObjectSource *this,CodedInputStream *stream,TypeInfo *typeinfo,Type *type)

{
  LogMessage *other;
  LogMessage local_58;
  LogFinisher local_19;
  
  (this->super_ObjectSource)._vptr_ObjectSource =
       (_func_int **)&PTR__ProtoStreamObjectSource_003c9050;
  this->stream_ = stream;
  this->typeinfo_ = typeinfo;
  this->own_typeinfo_ = false;
  this->type_ = type;
  this->use_lower_camel_for_enums_ = false;
  this->use_ints_for_enums_ = false;
  this->preserve_proto_field_names_ = false;
  this->recursion_depth_ = 0;
  this->max_recursion_depth_ = 0x40;
  this->render_unknown_fields_ = false;
  this->render_unknown_enum_values_ = true;
  this->add_trailing_zeros_for_timestamp_and_duration_ = false;
  this->suppress_empty_object_ = false;
  this->use_legacy_json_map_format_ = false;
  if (stream == (CodedInputStream *)0x0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/internal/protostream_objectsource.cc"
               ,0x99);
    other = protobuf::internal::LogMessage::operator<<(&local_58,"Input stream is nullptr.");
    protobuf::internal::LogFinisher::operator=(&local_19,other);
    protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

ProtoStreamObjectSource::ProtoStreamObjectSource(
    io::CodedInputStream* stream, const TypeInfo* typeinfo,
    const google::protobuf::Type& type)
    : stream_(stream),
      typeinfo_(typeinfo),
      own_typeinfo_(false),
      type_(type),
      use_lower_camel_for_enums_(false),
      use_ints_for_enums_(false),
      preserve_proto_field_names_(false),
      recursion_depth_(0),
      max_recursion_depth_(kDefaultMaxRecursionDepth),
      render_unknown_fields_(false),
      render_unknown_enum_values_(true),
      add_trailing_zeros_for_timestamp_and_duration_(false),
      suppress_empty_object_(false),
      use_legacy_json_map_format_(false) {
  GOOGLE_LOG_IF(DFATAL, stream == nullptr) << "Input stream is nullptr.";
}